

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWire.hpp
# Opt level: O0

void __thiscall gmlc::concurrency::TripWireDetector::TripWireDetector(TripWireDetector *this)

{
  shared_ptr<const_std::atomic<bool>_> *in_RDI;
  shared_ptr<std::atomic<bool>_> *in_stack_ffffffffffffffd8;
  
  TripWire::getLine();
  std::shared_ptr<std::atomic<bool>const>::shared_ptr<std::atomic<bool>,void>
            (in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<std::atomic<bool>_>::~shared_ptr((shared_ptr<std::atomic<bool>_> *)0x491d86);
  return;
}

Assistant:

TripWireDetector(): lineDetector(TripWire::getLine()) {}